

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * new_sub(C_Parser *parser,C_Node *lhs,C_Node *rhs,C_Token *tok)

{
  C_Type *pCVar1;
  _Bool _Var2;
  C_Node *pCVar3;
  C_Node *pCVar4;
  C_Node *pCVar5;
  
  C_add_type(parser,lhs);
  C_add_type(parser,rhs);
  _Var2 = C_is_numeric(lhs->ty);
  if ((_Var2) && (_Var2 = C_is_numeric(rhs->ty), _Var2)) {
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_SUB;
    pCVar3->tok = tok;
    pCVar3->lhs = lhs;
    pCVar3->rhs = rhs;
    return pCVar3;
  }
  pCVar1 = lhs->ty->base;
  if (pCVar1->kind == TY_VLA) {
    pCVar3 = new_var_node(parser,pCVar1->vla_size,tok);
  }
  else {
    _Var2 = C_is_integer(rhs->ty);
    pCVar1 = lhs->ty->base;
    if (!_Var2) {
      if ((pCVar1 != (C_Type *)0x0) && (rhs->ty->base != (C_Type *)0x0)) {
        pCVar3 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar3->kind = ND_SUB;
        pCVar3->tok = tok;
        pCVar3->lhs = lhs;
        pCVar3->rhs = rhs;
        pCVar3->ty = C_ty_long;
        pCVar4 = new_num(parser,(long)lhs->ty->base->size,tok);
        pCVar5 = (C_Node *)
                 (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        pCVar5->kind = ND_DIV;
        pCVar5->tok = tok;
        pCVar5->lhs = pCVar3;
        pCVar5->rhs = pCVar4;
        return pCVar5;
      }
      C_error_tok(parser,tok,"invalid operands");
    }
    pCVar3 = new_long(parser,(long)pCVar1->size,tok);
  }
  pCVar4 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar4->kind = ND_MUL;
  pCVar4->tok = tok;
  pCVar4->lhs = rhs;
  pCVar4->rhs = pCVar3;
  C_add_type(parser,pCVar4);
  pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar3->kind = ND_SUB;
  pCVar3->tok = tok;
  pCVar3->lhs = lhs;
  pCVar3->rhs = pCVar4;
  pCVar3->ty = lhs->ty;
  return pCVar3;
}

Assistant:

static C_Node *new_sub(C_Parser *parser, C_Node *lhs, C_Node *rhs, C_Token *tok) {
  C_add_type(parser, lhs);
  C_add_type(parser, rhs);

  // num - num
  if (C_is_numeric(lhs->ty) && C_is_numeric(rhs->ty))
    return new_binary(parser, ND_SUB, lhs, rhs, tok);

  // VLA + num
  if (lhs->ty->base->kind == TY_VLA) {
    rhs = new_binary(parser, ND_MUL, rhs, new_var_node(parser, lhs->ty->base->vla_size, tok), tok);
    C_add_type(parser, rhs);
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = lhs->ty;
    return node;
  }

  // ptr - num
  if (lhs->ty->base && C_is_integer(rhs->ty)) {
    rhs = new_binary(parser, ND_MUL, rhs, new_long(parser, lhs->ty->base->size, tok), tok);
    C_add_type(parser, rhs);
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = lhs->ty;
    return node;
  }

  // ptr - ptr, which returns how many elements are between the two.
  if (lhs->ty->base && rhs->ty->base) {
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = C_ty_long;
    return new_binary(parser, ND_DIV, node, new_num(parser, lhs->ty->base->size, tok), tok);
  }

  C_error_tok(parser, tok, "invalid operands");
  return NULL;
}